

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

double calc_mean_only_weighted<float,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind
                 ,unsigned_long *Xc_indptr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  size_t *psVar1;
  ulong *puVar2;
  double dVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ulong *puVar13;
  unsigned_long *puVar14;
  ulong *key;
  size_t row;
  double dVar15;
  double dVar16;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar17;
  tuple<> local_91;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_90;
  double local_88;
  unsigned_long *local_80;
  ulong *local_78;
  unsigned_long local_70;
  double local_68;
  undefined8 uStack_60;
  float *local_58;
  undefined8 uStack_50;
  size_t *local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_68 = (double)Xc_indptr[col_num];
  local_70 = Xc_indptr[col_num + 1];
  dVar15 = 0.0;
  if (local_68 != (double)local_70) {
    puVar13 = ix_arr + st;
    local_78 = ix_arr + end + 1;
    uVar7 = (long)local_78 - (long)puVar13 >> 3;
    key = puVar13;
    if (0 < (long)uVar7) {
      do {
        uVar8 = uVar7 >> 1;
        uVar10 = ~uVar8 + uVar7;
        uVar7 = uVar8;
        if (key[uVar8] < Xc_ind[(long)local_68]) {
          key = key + uVar8 + 1;
          uVar7 = uVar10;
        }
      } while (0 < (long)uVar7);
    }
    local_38 = Xc_ind[local_70 - 1];
    local_88 = 0.0;
    local_80 = Xc_ind;
    local_58 = Xc;
    local_48 = ix_arr;
    if (st <= end) {
      do {
        local_90._M_head_impl = puVar13;
        pVar17 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,puVar13,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_90,&local_91);
        local_88 = local_88 + *(double *)((pVar17.first.m_bucket.m_bucket)->m_value + 8);
        st = st + 1;
        puVar13 = puVar13 + 1;
      } while (st <= end);
    }
    pfVar6 = local_58;
    uVar5 = local_70;
    puVar4 = local_80;
    if (local_68 == (double)local_70 || key == local_78) {
      local_58 = (float *)0x0;
      dVar16 = 0.0;
    }
    else {
      local_40 = local_70 - 1;
      psVar1 = local_48 + end;
      local_58 = (float *)0x0;
      uStack_50 = 0;
      dVar16 = 0.0;
      uStack_60 = 0;
      dVar15 = local_68;
      uVar12 = local_70;
      puVar13 = local_78;
      puVar14 = local_80;
      while (uVar7 = *key, uVar7 <= local_38) {
        puVar2 = puVar14 + (long)dVar15;
        uVar8 = *puVar2;
        if (uVar8 == uVar7) {
          local_90._M_head_impl = key;
          local_68 = dVar16;
          if ((uint)ABS(pfVar6[(long)dVar15]) < 0x7f800000) {
            pVar17 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_90,&local_91);
            dVar3 = *(double *)((pVar17.first.m_bucket.m_bucket)->m_value + 8);
            dVar16 = local_68 + dVar3;
            local_58 = (float *)((double)local_58 +
                                (((double)pfVar6[(long)dVar15] - (double)local_58) * dVar3) / dVar16
                                );
          }
          else {
            pVar17 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_90,&local_91);
            local_88 = local_88 - *(double *)((pVar17.first.m_bucket.m_bucket)->m_value + 8);
            dVar16 = local_68;
          }
          if ((key == psVar1) || (dVar15 == (double)local_40)) break;
          puVar9 = puVar2 + 1;
          key = key + 1;
          uVar7 = (long)((long)puVar4 + (uVar5 * 8 - (long)puVar9)) >> 3;
          uVar12 = local_70;
          puVar13 = local_78;
          puVar14 = local_80;
          if (0 < (long)uVar7) {
            do {
              uVar8 = uVar7 >> 1;
              uVar10 = ~uVar8 + uVar7;
              uVar7 = uVar8;
              if ((puVar9 + uVar8 + 1)[-1] < *key) {
                puVar9 = puVar9 + uVar8 + 1;
                uVar7 = uVar10;
              }
            } while (0 < (long)uVar7);
          }
LAB_002f53b1:
          dVar15 = (double)((long)puVar9 - (long)puVar14 >> 3);
        }
        else {
          if (uVar8 <= uVar7) {
            puVar9 = puVar2 + 1;
            uVar8 = (long)((long)puVar4 + (uVar5 * 8 - (long)(puVar2 + 1))) >> 3;
            while (0 < (long)uVar8) {
              uVar10 = uVar8 >> 1;
              uVar11 = ~uVar10 + uVar8;
              uVar8 = uVar10;
              if ((puVar9 + uVar10 + 1)[-1] < uVar7) {
                puVar9 = puVar9 + uVar10 + 1;
                uVar8 = uVar11;
              }
            }
            goto LAB_002f53b1;
          }
          key = key + 1;
          uVar7 = (long)puVar13 - (long)key >> 3;
          while (0 < (long)uVar7) {
            uVar10 = uVar7 >> 1;
            uVar11 = ~uVar10 + uVar7;
            uVar7 = uVar10;
            if (key[uVar10] < uVar8) {
              key = key + uVar10 + 1;
              uVar7 = uVar11;
            }
          }
        }
        if ((key == puVar13) || (dVar15 == (double)uVar12)) break;
      }
    }
    dVar15 = 0.0;
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      dVar15 = (double)(~-(ulong)(dVar16 < local_88) & (ulong)local_58 |
                       (ulong)((dVar16 / local_88) * (double)local_58) & -(ulong)(dVar16 < local_88)
                       );
    }
  }
  return dVar15;
}

Assistant:

double calc_mean_only_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos]))) {
                cnt -= w[*row];
            }

            else {
                w_this = w[*row];
                added += w_this;
                m += w_this * (Xc[curr_pos] - m) / added;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= (ldouble_safe)added / (ldouble_safe)cnt;

    return m;
}